

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall FirstTagWithMandatory::FirstTagWithMandatory(FirstTagWithMandatory *this)

{
  tag_t<cfgfile::string_trait_t> *in_RDI;
  SecondMandatoryTag *unaff_retaddr;
  string_t *name;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  tag_t<cfgfile::string_trait_t> *owner;
  
  name = (string_t *)&local_29;
  owner = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (in_stack_ffffffffffffffc0,name,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  in_RDI->_vptr_tag_t = (_func_int **)&PTR__FirstTagWithMandatory_001af610;
  *(undefined1 *)&in_RDI[1]._vptr_tag_t = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_tag_t + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_tag_t + 2) = 0;
  SecondMandatoryTag::SecondMandatoryTag(unaff_retaddr,owner);
  return;
}

Assistant:

FirstTagWithMandatory()
		:	cfgfile::tag_t<>( "firstTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
		,	m_child( *this )
	{
	}